

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

SurfaceParameterizationQuantity * __thiscall
polyscope::SurfaceMesh::getParameterization(SurfaceMesh *this,string *name)

{
  QuantityType *pQVar1;
  string *in_RSI;
  SurfaceParameterizationQuantity *param;
  SurfaceMeshQuantity *newQ;
  SurfaceParameterizationQuantity *local_78;
  string *name_00;
  QuantityStructure<polyscope::SurfaceMesh> *in_stack_ffffffffffffffa8;
  string local_38;
  QuantityType *local_18;
  
  name_00 = &local_38;
  std::__cxx11::string::string((string *)name_00,in_RSI);
  pQVar1 = QuantityStructure<polyscope::SurfaceMesh>::getQuantity(in_stack_ffffffffffffffa8,name_00)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  if (pQVar1 == (QuantityType *)0x0) {
    local_78 = (SurfaceParameterizationQuantity *)0x0;
  }
  else {
    local_18 = pQVar1;
    local_78 = (SurfaceParameterizationQuantity *)
               __dynamic_cast(pQVar1,&SurfaceMeshQuantity::typeinfo,
                              &SurfaceParameterizationQuantity::typeinfo,0);
  }
  return local_78;
}

Assistant:

SurfaceParameterizationQuantity* SurfaceMesh::getParameterization(std::string name) {
  SurfaceMeshQuantity* newQ = this->getQuantity(name);
  SurfaceParameterizationQuantity* param = dynamic_cast<SurfaceParameterizationQuantity*>(newQ);
  return param;
}